

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::BasicWorkGroupSizeIsConst::Run(BasicWorkGroupSizeIsConst *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  void *pvVar2;
  bool *compile_error;
  ulong uVar3;
  GLuint i;
  ulong uVar4;
  long lVar5;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "\nlayout(local_size_x = 2, local_size_y = 3, local_size_z = 4) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_buffer[22 + gl_WorkGroupSize.x];\n};\nshared uint g_shared[gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z];\nuniform uint g_uniform[gl_WorkGroupSize.z + 20] = { 1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24 };\nvoid main() {\n  g_shared[gl_LocalInvocationIndex] = 1U;\n  groupMemoryBarrier();\n  barrier();\n  uint sum = 0;\n  for (uint i = 0; i < gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z; ++i) {\n    sum += g_shared[i];\n  }\n  sum += g_uniform[gl_LocalInvocationIndex];\n  g_buffer[gl_LocalInvocationIndex] = sum;\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_48);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar5 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x60,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
    pvVar2 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x60,1);
    uVar4 = 0;
    lVar5 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + uVar4 * 4);
      if (uVar4 + 0x19 != uVar3) {
        anon_unknown_0::Output
                  ("Data at index %u is %u should be %u.\n",uVar4 & 0xffffffff,uVar3,
                   (ulong)((int)uVar4 + 0x19));
        lVar5 = -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x18);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 2, local_size_y = 3, local_size_z = 4) in;" NL
			   "layout(std430, binding = 0) buffer Output {" NL "  uint g_buffer[22 + gl_WorkGroupSize.x];" NL "};" NL
			   "shared uint g_shared[gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z];" NL
			   "uniform uint g_uniform[gl_WorkGroupSize.z + 20] = { "
			   "1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24 };" NL "void main() {" NL
			   "  g_shared[gl_LocalInvocationIndex] = 1U;" NL "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  uint sum = 0;" NL
			   "  for (uint i = 0; i < gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z; ++i) {" NL
			   "    sum += g_shared[i];" NL "  }" NL "  sum += g_uniform[gl_LocalInvocationIndex];" NL
			   "  g_buffer[gl_LocalInvocationIndex] = sum;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 24 * sizeof(GLuint), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		data =
			static_cast<GLuint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * 24, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 24; ++i)
		{
			if (data[i] != (i + 25))
			{
				Output("Data at index %u is %u should be %u.\n", i, data[i], i + 25);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}